

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O2

void __thiscall TPZOneShapeRestraint::TPZOneShapeRestraint(TPZOneShapeRestraint *this)

{
  pair<long,_int> *ppVar1;
  long lVar2;
  int local_14;
  
  TPZManVector<std::pair<long,_int>,_4>::TPZManVector(&this->fFaces,4);
  TPZManVector<int,_4>::TPZManVector(&this->fOrient,4,&local_14);
  ppVar1 = (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    *(undefined8 *)((long)&ppVar1->first + lVar2) = 0xffffffffffffffff;
    *(undefined4 *)((long)&ppVar1->second + lVar2) = 0xffffffff;
  }
  return;
}

Assistant:

TPZOneShapeRestraint() : fFaces(4), fOrient(4,-1)
    {
        for(int i=0; i<4; i++)
        {
            fFaces[i] = std::make_pair<int64_t,int>(-1, -1);
        }
    }